

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chan.h
# Opt level: O0

void __thiscall
dap::Chan<std::function<void_()>_>::put(Chan<std::function<void_()>_> *this,function<void_()> *in)

{
  size_type sVar1;
  byte local_51;
  undefined1 local_28 [7];
  bool notify;
  unique_lock<std::mutex> lock;
  function<void_()> *in_local;
  Chan<std::function<void_()>_> *this_local;
  
  lock._8_8_ = in;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mutex);
  sVar1 = std::
          queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
          ::size(&this->queue);
  local_51 = 0;
  if (sVar1 == 0) {
    local_51 = this->closed ^ 0xff;
  }
  std::
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  ::push(&this->queue,(value_type *)lock._8_8_);
  if ((local_51 & 1) != 0) {
    std::condition_variable::notify_all();
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void Chan<T>::put(T&& in) {
  std::unique_lock<std::mutex> lock(mutex);
  auto notify = queue.size() == 0 && !closed;
  queue.push(std::move(in));
  if (notify) {
    cv.notify_all();
  }
}